

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  ostream *poVar2;
  Renderer renderer;
  Game game;
  Renderer RStack_27e8;
  Game local_27b8;
  
  Renderer::Renderer(&RStack_27e8,0x280,0x280,0x20,0x20);
  Game::Game(&local_27b8,0x20,0x20);
  Game::Run(&local_27b8,&RStack_27e8,0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Game has terminated successfully!\n",0x22);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Score: ",7);
  iVar1 = Game::GetScore(&local_27b8);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Size: ",6);
  iVar1 = Game::GetSize(&local_27b8);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::random_device::_M_fini();
  if (local_27b8.snake2.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_27b8.snake2.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_27b8.snake2.body.
                          super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_27b8.snake2.body.
                          super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_27b8.snake.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_27b8.snake.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_27b8.snake.body.
                          super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_27b8.snake.body.
                          super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Renderer::~Renderer(&RStack_27e8);
  return 0;
}

Assistant:

int main() {
  constexpr std::size_t kFramesPerSecond{60};
  constexpr std::size_t kMsPerFrame{1000 / kFramesPerSecond};
  constexpr std::size_t kScreenWidth{640};
  constexpr std::size_t kScreenHeight{640};
  constexpr std::size_t kGridWidth{32};
  constexpr std::size_t kGridHeight{32};
    
  Renderer renderer(kScreenWidth, kScreenHeight, kGridWidth, kGridHeight);
  Game game(kGridWidth, kGridHeight);
  game.Run(renderer, kMsPerFrame);
  std::cout << "Game has terminated successfully!\n";
  std::cout << "Score: " << game.GetScore() << "\n";
  std::cout << "Size: " << game.GetSize() << "\n";
  return 0;
}